

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O1

void __thiscall
manual_course::manual_course
          (manual_course *this,double theta_,double delta_,double kappa_min_,double kappa_step_,
          double init_policy_random_,int length_)

{
  double dVar1;
  _Head_base<0UL,_double_*,_false> _Var2;
  double *pdVar3;
  double *__s;
  double *__s_00;
  double *__s_01;
  manual_course *this_00;
  ulong uVar4;
  undefined8 extraout_RAX;
  long lVar5;
  long lVar6;
  ulong uVar7;
  pointer *__ptr;
  double dVar8;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < length_) {
    uVar4 = (long)length_ * 8;
  }
  _Var2._M_head_impl = (double *)operator_new__(uVar4);
  memset(_Var2._M_head_impl,0,uVar4);
  (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = _Var2._M_head_impl;
  pdVar3 = (double *)operator_new__(uVar4);
  memset(pdVar3,0,uVar4);
  (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar3;
  __s = (double *)operator_new__(uVar4);
  memset(__s,0,uVar4);
  (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  __s_00 = (double *)operator_new__(uVar4);
  memset(__s_00,0,uVar4);
  (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s_00;
  __s_01 = (double *)operator_new__(uVar4);
  memset(__s_01,0,uVar4);
  (this->init_policy_random)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s_01;
  uVar4 = 0xffffffffffffffff;
  if (-1 < length_) {
    uVar4 = (long)length_ * 4;
  }
  this_00 = (manual_course *)operator_new__(uVar4);
  memset(this_00,0,uVar4);
  (this->iterators)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)this_00;
  this->length = length_;
  if (2 < length_) {
    *_Var2._M_head_impl = theta_;
    dVar8 = (double)length_;
    _Var2._M_head_impl[1] = 1.0 / dVar8;
    *pdVar3 = delta_;
    pdVar3[1] = 0.1 / dVar8;
    *__s = kappa_min_;
    __s[1] = 0.01 / dVar8;
    *__s_00 = kappa_step_;
    __s_00[1] = 1e-07 / dVar8;
    *__s_01 = init_policy_random_;
    __s_01[1] = 0.9 / dVar8;
    uVar7 = (ulong)(uint)length_;
    dVar1 = _Var2._M_head_impl[1];
    uVar4 = 2;
    do {
      dVar1 = 1.0 / dVar8 + dVar1;
      _Var2._M_head_impl[uVar4] = dVar1;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
    lVar6 = uVar7 - 2;
    lVar5 = 0;
    do {
      pdVar3[lVar5 + 2] = 0.1 / (dVar8 * 5.0) + _Var2._M_head_impl[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
    lVar5 = 0;
    do {
      __s[lVar5 + 2] = 0.01 / dVar8 + _Var2._M_head_impl[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
    lVar5 = 0;
    do {
      __s_00[lVar5 + 2] = 1e-07 / (dVar8 * 5.0) + _Var2._M_head_impl[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
    lVar6 = 0;
    do {
      __s_01[lVar6 + 2] = 0.9 / dVar8 + _Var2._M_head_impl[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (uVar7 - 2 != lVar6);
    memset(this_00,0,uVar7 << 2);
    return;
  }
  manual_course(this_00);
  operator_delete__(__s_01);
  (this->init_policy_random)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  pdVar3 = (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
           _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (pdVar3 != (double *)0x0) {
    operator_delete__(pdVar3);
  }
  (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  pdVar3 = (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
           .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (pdVar3 != (double *)0x0) {
    operator_delete__(pdVar3);
  }
  (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  pdVar3 = (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (pdVar3 != (double *)0x0) {
    operator_delete__(pdVar3);
  }
  (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  _Var2._M_head_impl =
       (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (double *)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

manual_course(double theta_,
                  double delta_,
                  double kappa_min_,
                  double kappa_step_,
                  double init_policy_random_,
                  int length_)
      : theta(std::make_unique<double[]>(length_))
      , delta(std::make_unique<double[]>(length_))
      , kappa_min(std::make_unique<double[]>(length_))
      , kappa_step(std::make_unique<double[]>(length_))
      , init_policy_random(std::make_unique<double[]>(length_))
      , iterators(std::make_unique<int[]>(length_))
      , length(length_)
    {
        bx_ensures(length > 2);

        theta[0] = theta_;
        theta[1] = 1.0 / static_cast<double>(length);

        delta[0] = delta_;
        delta[1] = 0.1 / static_cast<double>(length);

        kappa_min[0] = kappa_min_;
        kappa_min[1] = 1e-2 / static_cast<double>(length);

        kappa_step[0] = kappa_step_;
        kappa_step[1] = 1e-7 / static_cast<double>(length);

        init_policy_random[0] = init_policy_random_;
        init_policy_random[1] = 0.9 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            theta[i] = theta[i - 1] + 1.0 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            delta[i] =
              theta[i - 1] + 0.1 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            kappa_min[i] = theta[i - 1] + 1e-2 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            kappa_step[i] =
              theta[i - 1] + 1e-7 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            init_policy_random[i] =
              theta[i - 1] + 0.9 / static_cast<double>(length);

        reset();
    }